

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O0

void __thiscall FileReader::FileReader(FileReader *this,string *filename)

{
  string *psVar1;
  _Ios_Openmode _Var2;
  runtime_error *this_00;
  fpos<__mbstate_t> local_b8;
  undefined1 local_a1;
  char local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  fpos local_60 [16];
  size_t local_50;
  ptrdiff_t file_size;
  undefined8 uStack_40;
  undefined8 local_38;
  string *local_18;
  string *filename_local;
  FileReader *this_local;
  
  local_18 = (string *)filename;
  filename_local = &this->filename;
  std::__cxx11::string::string((string *)this,(string *)filename);
  psVar1 = local_18;
  _Var2 = std::operator|(_S_in,_S_bin);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::fstream::fstream((fstream *)&this->file,psVar1,_Var2);
  file_size = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&file_size);
  BufferReader::BufferReader(&this->buffer,(vector<char,_std::allocator<char>_> *)&file_size);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&file_size);
  local_60 = (fpos  [16])std::istream::tellg();
  local_50 = std::fpos::operator_cast_to_long(local_60);
  if ((long)local_50 < 0) {
    local_a1 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Failed to get size of file ");
    std::operator+(local_80,local_a0);
    std::runtime_error::runtime_error(this_00,(string *)local_80);
    local_a1 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::fpos<__mbstate_t>::fpos(&local_b8,0);
  std::istream::seekg(&this->file,local_b8._M_off,local_b8._M_state);
  this->size = local_50;
  this->offset = 0;
  if ((this->size & 3) == 0) {
    return;
  }
  __assert_fail("size % sizeof(float) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/file_reader.cpp"
                ,0x16,"FileReader::FileReader(const std::string &)");
}

Assistant:

FileReader::FileReader(const std::string &filename) :
		filename(filename),
		file(std::fstream(filename, std::ios::in | std::ios::binary | std::ios::ate)),
		buffer(BufferReader(std::vector<char>()))
{
	ptrdiff_t file_size = file.tellg();
	if (file_size < 0) {
		throw std::runtime_error("Failed to get size of file " + filename + "!");
	}
	file.seekg(0);

	size = (size_t) file_size;
	offset = 0;
	assert(size % sizeof(float) == 0);
}